

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

FilterResult __thiscall
duckdb::FilterCombiner::AddTransitiveFilters
          (FilterCombiner *this,BoundComparisonExpression *comparison,bool is_root)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  LogicalTypeId LVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined8 uVar3;
  LogicalTypeId LVar4;
  bool bVar5;
  int iVar6;
  FilterResult FVar7;
  uint uVar8;
  FilterResult FVar9;
  type pEVar10;
  Expression *expr;
  Expression *expr_00;
  BoundCastExpression *pBVar11;
  pointer pEVar12;
  BoundColumnRefExpression *pBVar13;
  BoundCastExpression *pBVar14;
  _Hash_node_base this_01;
  BoundColumnRefExpression *pBVar15;
  iterator iVar16;
  iterator iVar17;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  BoundComparisonExpression *comparison_00;
  ExpressionType EVar19;
  undefined7 in_register_00000011;
  byte bVar20;
  FilterCombiner *pFVar21;
  Value *pVVar22;
  __node_base *p_Var23;
  ExpressionType local_129;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_128;
  Expression *local_120;
  uint local_114;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_110;
  FilterCombiner *local_108;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_100;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_f8;
  Value *local_f0;
  undefined4 local_e4;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_e0;
  BoundComparisonExpression *local_d8;
  idx_t left_equivalence_set;
  idx_t right_equivalence_set;
  ExpressionValueInformation info;
  ulong uVar18;
  
  EVar19 = (comparison->super_Expression).super_BaseExpression.type;
  FVar7 = UNSUPPORTED;
  if ((((EVar19 & 0xfd) == COMPARE_GREATERTHAN) || (EVar19 == COMPARE_LESSTHANOREQUALTO)) ||
     (EVar19 == COMPARE_LESSTHAN)) {
    local_e4 = (undefined4)CONCAT71(in_register_00000011,is_root);
    local_f8 = &comparison->left;
    local_d8 = comparison;
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(local_f8);
    expr = GetNode(this,pEVar10);
    local_e0 = &comparison->right;
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(local_e0);
    expr_00 = GetNode(this,pEVar10);
    if ((expr_00->super_BaseExpression).type == OPERATOR_CAST) {
      pBVar11 = BaseExpression::Cast<duckdb::BoundCastExpression>(&expr_00->super_BaseExpression);
      this_00 = &pBVar11->child;
      pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_00);
      if ((pEVar12->super_BaseExpression).type == BOUND_COLUMN_REF) {
        local_f0 = (Value *)this_00;
        pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_00);
        pBVar13 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                            (&pEVar12->super_BaseExpression);
        p_Var23 = &(this->stored_expressions)._M_h._M_before_begin;
        local_108 = this;
        do {
          do {
            p_Var23 = p_Var23->_M_nxt;
            this = local_108;
            if (p_Var23 == (__node_base *)0x0) goto LAB_0125760a;
            this_01._M_nxt = p_Var23[1]._M_nxt;
            EVar19 = *(ExpressionType *)(this_01._M_nxt + 1);
            if (EVar19 == OPERATOR_CAST) {
              pBVar14 = BaseExpression::Cast<duckdb::BoundCastExpression>
                                  (&expr_00->super_BaseExpression);
              this_01._M_nxt =
                   (_Hash_node_base *)
                   unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(&pBVar14->child);
              EVar19 = (((type)this_01._M_nxt)->super_BaseExpression).type;
            }
          } while (((EVar19 != BOUND_COLUMN_REF) ||
                   (pBVar15 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                        ((BaseExpression *)this_01._M_nxt),
                   (pBVar15->binding).table_index != (pBVar13->binding).table_index)) ||
                  ((pBVar15->binding).column_index != (pBVar13->binding).column_index));
          pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)(p_Var23 + 2));
          bVar5 = LogicalType::operator!=
                            (&(pBVar11->super_Expression).return_type,&pEVar12->return_type);
        } while (bVar5);
        pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)(p_Var23 + 2));
        (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&info,pEVar12);
        uVar3 = info.constant.type_._0_8_;
        pVVar22 = local_f0;
        info.constant.type_.id_ = INVALID;
        info.constant.type_.physical_type_ = ~INVALID;
        info.constant.type_._2_6_ = 0;
        _Var2._M_head_impl =
             (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
              &local_f0->type_)->_M_t).
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
         &local_f0->type_)->_M_t).
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
        if ((_Var2._M_head_impl != (Expression *)0x0) &&
           ((**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))(),
           info.constant.type_._0_8_ != 0)) {
          (**(code **)(*(long *)info.constant.type_._0_8_ + 8))();
        }
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)pVVar22);
        this = local_108;
        expr_00 = GetNode(local_108,pEVar10);
      }
    }
LAB_0125760a:
    FVar7 = UNSUPPORTED;
    iVar6 = (*(expr->super_BaseExpression)._vptr_BaseExpression[10])(expr,expr_00);
    if ((char)iVar6 == '\0') {
      left_equivalence_set = GetEquivalenceSet(this,expr);
      right_equivalence_set = GetEquivalenceSet(this,expr_00);
      FVar7 = SUCCESS;
      if (left_equivalence_set != right_equivalence_set) {
        iVar16 = ::std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
                 ::find(&(this->constant_values)._M_t,&left_equivalence_set);
        iVar17 = ::std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
                 ::find(&(this->constant_values)._M_t,&right_equivalence_set);
        pVVar22 = (Value *)iVar17._M_node[1]._M_parent;
        local_f0 = (Value *)iVar17._M_node[1]._M_left;
        local_100 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                     *)&this->remaining_filters;
        local_114 = 0;
        bVar20 = 0;
        local_108 = this;
        for (; pVVar22 != local_f0; pVVar22 = (Value *)&pVVar22[1].type_.type_info_) {
          ExpressionValueInformation::ExpressionValueInformation(&info);
          Value::operator=(&info.constant,pVVar22);
          LVar1 = pVVar22[1].type_.id_;
          EVar19 = (local_d8->super_Expression).super_BaseExpression.type;
          LVar4 = EVar19;
          if (LVar1 == VARCHAR) {
LAB_012576df:
            info.comparison_type = LVar4;
            pFVar21 = (FilterCombiner *)&stack0xffffffffffffff88;
            ExpressionValueInformation::ExpressionValueInformation
                      ((ExpressionValueInformation *)&stack0xffffffffffffff88,&info);
            FVar7 = AddConstantComparison
                              (pFVar21,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                        *)&iVar16._M_node[1]._M_parent,
                               (ExpressionValueInformation *)&stack0xffffffffffffff88);
            Value::~Value((Value *)&stack0xffffffffffffff88);
            bVar20 = 1;
            if (FVar7 == UNSATISFIABLE) {
              Value::~Value(&info.constant);
              goto LAB_01257971;
            }
          }
          else {
            switch(EVar19) {
            case COMPARE_LESSTHAN:
              if ((LVar1 == USMALLINT) || (LVar1 == INTERVAL)) {
LAB_01257814:
                if ((local_114 & 1) == 0) {
                  local_129 = EVar19;
                  info.comparison_type = EVar19;
                  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->(local_f8);
                  (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_128,pEVar12);
                  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->(local_e0);
                  (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_110,pEVar12);
                  make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                            ((duckdb *)&local_120,&local_129,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_128,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_110);
                  if (local_110._M_head_impl != (Expression *)0x0) {
                    (*((local_110._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  if (local_128._M_head_impl != (Expression *)0x0) {
                    (*((local_128._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  local_128._M_head_impl = local_120;
                  local_120 = (Expression *)0x0;
                  ::std::
                  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  ::
                  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                            (local_100,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_128);
                  uVar18 = extraout_RAX_00;
                  goto LAB_012578b8;
                }
                goto LAB_012576df;
              }
              break;
            case COMPARE_GREATERTHAN:
              if ((LVar1 & ~UNKNOWN) == UTINYINT) goto LAB_01257814;
              break;
            case COMPARE_LESSTHANOREQUALTO:
              if ((LVar1 == USMALLINT) || (LVar1 == INTERVAL)) {
LAB_0125775f:
                LVar4 = LVar1;
                if ((local_114 & 1) != 0) goto LAB_012576df;
                local_129 = EVar19;
                info.comparison_type = LVar1;
                pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(local_f8);
                (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_128,pEVar12);
                pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(local_e0);
                (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_110,pEVar12);
                make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((duckdb *)&local_120,&local_129,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_128,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_110);
                if (local_110._M_head_impl != (Expression *)0x0) {
                  (*((local_110._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                }
                if (local_128._M_head_impl != (Expression *)0x0) {
                  (*((local_128._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                }
                local_128._M_head_impl = local_120;
                local_120 = (Expression *)0x0;
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          (local_100,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_128);
                uVar18 = extraout_RAX;
LAB_012578b8:
                if (local_128._M_head_impl != (Expression *)0x0) {
                  uVar8 = (*((local_128._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1]
                          )();
                  uVar18 = (ulong)uVar8;
                }
                if (local_120 != (Expression *)0x0) {
                  uVar8 = (*(local_120->super_BaseExpression)._vptr_BaseExpression[1])();
                  uVar18 = (ulong)uVar8;
                }
                local_114 = (uint)CONCAT71((int7)(uVar18 >> 8),1);
                LVar4 = info.comparison_type;
                goto LAB_012576df;
              }
              break;
            case COMPARE_GREATERTHANOREQUALTO:
              if ((LVar1 & ~UNKNOWN) == UTINYINT) goto LAB_0125775f;
            }
          }
          Value::~Value(&info.constant);
        }
        if (((byte)local_e4 & bVar20) == 1) {
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                    (local_f8);
          pFVar21 = local_108;
          FindTransitiveFilter((FilterCombiner *)&info,(Expression *)local_108);
          FVar7 = SUCCESS;
          if (info.constant.type_._0_8_ != 0) {
            pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)&info);
            comparison_00 =
                 BaseExpression::Cast<duckdb::BoundComparisonExpression>
                           (&pEVar12->super_BaseExpression);
            FVar9 = AddTransitiveFilters(pFVar21,comparison_00,false);
            if (FVar9 == UNSATISFIABLE) {
              if (info.constant.type_._0_8_ != 0) {
                (**(code **)(*(long *)info.constant.type_._0_8_ + 8))();
              }
LAB_01257971:
              FVar7 = UNSATISFIABLE;
            }
            else {
              if (FVar9 == UNSUPPORTED) {
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          (local_100,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&info);
              }
              if (info.constant.type_._0_8_ != 0) {
                (**(code **)(*(long *)info.constant.type_._0_8_ + 8))();
              }
            }
          }
        }
        else {
          FVar7 = UNSUPPORTED - bVar20;
        }
      }
    }
  }
  return FVar7;
}

Assistant:

FilterResult FilterCombiner::AddTransitiveFilters(BoundComparisonExpression &comparison, bool is_root) {
	if (!IsGreaterThan(comparison.GetExpressionType()) && !IsLessThan(comparison.GetExpressionType())) {
		return FilterResult::UNSUPPORTED;
	}
	// get the LHS and RHS nodes
	auto &left_node = GetNode(*comparison.left);
	reference<Expression> right_node = GetNode(*comparison.right);
	// In case with filters like CAST(i) = j and i = 5 we replace the COLUMN_REF i with the constant 5
	do {
		if (right_node.get().GetExpressionType() != ExpressionType::OPERATOR_CAST) {
			break;
		}
		auto &bound_cast_expr = right_node.get().Cast<BoundCastExpression>();
		if (bound_cast_expr.child->GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
			break;
		}
		auto &col_ref = bound_cast_expr.child->Cast<BoundColumnRefExpression>();
		for (auto &stored_exp : stored_expressions) {
			reference<Expression> expr = stored_exp.first;
			if (expr.get().GetExpressionType() == ExpressionType::OPERATOR_CAST) {
				expr = *(right_node.get().Cast<BoundCastExpression>().child);
			}
			if (expr.get().GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
				continue;
			}
			auto &st_col_ref = expr.get().Cast<BoundColumnRefExpression>();
			if (st_col_ref.binding != col_ref.binding) {
				continue;
			}
			if (bound_cast_expr.return_type != stored_exp.second->return_type) {
				continue;
			}
			bound_cast_expr.child = stored_exp.second->Copy();
			right_node = GetNode(*bound_cast_expr.child);
			break;
		}
	} while (false);

	if (left_node.Equals(right_node)) {
		return FilterResult::UNSUPPORTED;
	}
	// get the equivalence sets of the LHS and RHS
	idx_t left_equivalence_set = GetEquivalenceSet(left_node);
	idx_t right_equivalence_set = GetEquivalenceSet(right_node);
	if (left_equivalence_set == right_equivalence_set) {
		// this equality filter already exists, prune it
		return FilterResult::SUCCESS;
	}

	vector<ExpressionValueInformation> &left_constants = constant_values.find(left_equivalence_set)->second;
	vector<ExpressionValueInformation> &right_constants = constant_values.find(right_equivalence_set)->second;
	bool is_successful = false;
	bool is_inserted = false;
	// read every constant filters already inserted for the right scalar variable
	// and see if we can create new transitive filters, e.g., there is already a filter i > 10,
	// suppose that we have now the j >= i, then we can infer a new filter j > 10
	for (const auto &right_constant : right_constants) {
		ExpressionValueInformation info;
		info.constant = right_constant.constant;
		// there is already an equality filter, e.g., i = 10
		if (right_constant.comparison_type == ExpressionType::COMPARE_EQUAL) {
			// create filter j [>, >=, <, <=] 10
			// suppose the new comparison is j >= i and we have already a filter i = 10,
			// then we create a new filter j >= 10
			// and the filter j >= i can be pruned by not adding it into the remaining filters
			info.comparison_type = comparison.GetExpressionType();
		} else if ((comparison.GetExpressionType() == ExpressionType::COMPARE_GREATERTHANOREQUALTO &&
		            IsGreaterThan(right_constant.comparison_type)) ||
		           (comparison.GetExpressionType() == ExpressionType::COMPARE_LESSTHANOREQUALTO &&
		            IsLessThan(right_constant.comparison_type))) {
			// filters (j >= i AND i [>, >=] 10) OR (j <= i AND i [<, <=] 10)
			// create filter j [>, >=] 10 and add the filter j [>=, <=] i into the remaining filters
			info.comparison_type = right_constant.comparison_type; // create filter j [>, >=, <, <=] 10
			if (!is_inserted) {
				// Add the filter j >= i in the remaing filters
				auto filter = make_uniq<BoundComparisonExpression>(comparison.GetExpressionType(),
				                                                   comparison.left->Copy(), comparison.right->Copy());
				remaining_filters.push_back(std::move(filter));
				is_inserted = true;
			}
		} else if ((comparison.GetExpressionType() == ExpressionType::COMPARE_GREATERTHAN &&
		            IsGreaterThan(right_constant.comparison_type)) ||
		           (comparison.GetExpressionType() == ExpressionType::COMPARE_LESSTHAN &&
		            IsLessThan(right_constant.comparison_type))) {
			// filters (j > i AND i [>, >=] 10) OR j < i AND i [<, <=] 10
			// create filter j [>, <] 10 and add the filter j [>, <] i into the remaining filters
			// the comparisons j > i and j < i are more restrictive
			info.comparison_type = comparison.GetExpressionType();
			if (!is_inserted) {
				// Add the filter j [>, <] i
				auto filter = make_uniq<BoundComparisonExpression>(comparison.GetExpressionType(),
				                                                   comparison.left->Copy(), comparison.right->Copy());
				remaining_filters.push_back(std::move(filter));
				is_inserted = true;
			}
		} else {
			// we cannot add a new filter
			continue;
		}
		// Add the new filer into the left set
		if (AddConstantComparison(left_constants, info) == FilterResult::UNSATISFIABLE) {
			return FilterResult::UNSATISFIABLE;
		}
		is_successful = true;
	}
	if (is_successful) {
		if (is_root) {
			// now check for remaining transitive filters from the left column
			auto transitive_filter = FindTransitiveFilter(*comparison.left);
			if (transitive_filter != nullptr) {
				// try to add transitive filters
				auto &transitive_cast = transitive_filter->Cast<BoundComparisonExpression>();
				auto transitive_result = AddTransitiveFilters(transitive_cast, false);
				if (transitive_result == FilterResult::UNSUPPORTED) {
					// in case of unsuccessful re-add filter into remaining ones
					remaining_filters.push_back(std::move(transitive_filter));
				}
				if (transitive_result == FilterResult::UNSATISFIABLE) {
					// while adding transitive filters we discovered the filter is unsatisfisable - we can prune
					return FilterResult::UNSATISFIABLE;
				}
			}
		}
		return FilterResult::SUCCESS;
	}

	return FilterResult::UNSUPPORTED;
}